

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::notify_log_append_completion(raft_server *this,bool ok)

{
  ulong uVar1;
  bool bVar2;
  srv_role sVar3;
  int iVar4;
  element_type *peVar5;
  ulong *puVar6;
  raft_server *this_00;
  __int_type_conflict _Var7;
  element_type *peVar8;
  char *pcVar9;
  byte in_SIL;
  long in_RDI;
  unique_lock<std::recursive_mutex> guard_1;
  uint64_t committed_index;
  uint64_t prev_committed_index;
  unique_lock<std::recursive_mutex> guard;
  ulong in_stack_00000110;
  memory_order __b;
  raft_server *in_stack_000001a0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  unique_lock<std::recursive_mutex> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  EventAwaiter *in_stack_fffffffffffffef0;
  string local_d0 [48];
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  string local_88 [64];
  string local_48 [39];
  byte local_21;
  ulong local_18;
  memory_order local_10;
  int local_c;
  ulong *local_8;
  
  local_21 = in_SIL & 1;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar2) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2c9f5e);
    iVar4 = (*peVar5->_vptr_logger[7])();
    if (5 < iVar4) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2c9f81);
      pcVar9 = "FAILED";
      if ((local_21 & 1) != 0) {
        pcVar9 = "OK";
      }
      msg_if_given_abi_cxx11_((char *)local_48,"got log append completion notification: %s",pcVar9);
      (*peVar5->_vptr_logger[8])
                (peVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"notify_log_append_completion",0x4c0,local_48);
      std::__cxx11::string::~string(local_48);
    }
  }
  sVar3 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x2ca031);
  if (sVar3 == leader) {
    std::unique_lock<std::recursive_mutex>::unique_lock
              (in_stack_fffffffffffffee0,
               (mutex_type *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    if ((local_21 & 1) == 0) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ca08c);
        iVar4 = (*peVar5->_vptr_logger[7])();
        if (1 < iVar4) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ca0bc);
          msg_if_given_abi_cxx11_((char *)local_88,"log appending failed, resign immediately");
          (*peVar5->_vptr_logger[8])
                    (peVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"notify_log_append_completion",0x4c6,local_88);
          std::__cxx11::string::~string(local_88);
        }
      }
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                 ,(__int_type_conflict1)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      become_follower((raft_server *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    }
    else {
      puVar6 = (ulong *)(in_RDI + 0xa0);
      local_c = 5;
      local_8 = puVar6;
      local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_c - 1U < 2) {
        local_18 = *puVar6;
      }
      else if (local_c == 5) {
        local_18 = *puVar6;
      }
      else {
        local_18 = *puVar6;
      }
      uVar1 = local_18;
      this_00 = (raft_server *)get_expected_committed_log_idx(in_stack_000001a0);
      commit(___b,in_stack_00000110);
      _Var7 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (uVar1 < _Var7) {
        request_append_entries_for_all(this_00);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_fffffffffffffee0);
  }
  else if ((local_21 & 1) == 0) {
    std::unique_lock<std::recursive_mutex>::unique_lock
              (in_stack_fffffffffffffee0,
               (mutex_type *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ca32b);
      iVar4 = (*peVar5->_vptr_logger[7])();
      if (0 < iVar4) {
        in_stack_fffffffffffffee0 =
             (unique_lock<std::recursive_mutex> *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ca35b);
        msg_if_given_abi_cxx11_((char *)local_d0,"log appending failed, stop this server");
        (**(_func_int **)
           ((long)&in_stack_fffffffffffffee0->_M_device[1].super___recursive_mutex_base._M_mutex +
           0x18))(in_stack_fffffffffffffee0,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                  ,"notify_log_append_completion",0x4de,local_d0);
        std::__cxx11::string::~string(local_d0);
      }
    }
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2ca3f6);
    peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ca3fe);
    (*peVar8->_vptr_state_mgr[8])(peVar8,0xffffffeb);
    std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_fffffffffffffee0);
  }
  else {
    EventAwaiter::invoke(in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void raft_server::notify_log_append_completion(bool ok) {
    p_tr("got log append completion notification: %s", ok ? "OK" : "FAILED");

    if (role_ == srv_role::leader) {
        recur_lock(lock_);
        if (!ok) {
            // If log appending fails, leader should resign immediately.
            p_er("log appending failed, resign immediately");
            leader_ = -1;
            become_follower();

            // Clear this flag to avoid pre-vote rejection.
            hb_alive_ = false;
            return;
        }

        // Leader: commit the log and send append_entries request, if needed.
        uint64_t prev_committed_index = quick_commit_index_.load();
        uint64_t committed_index = get_expected_committed_log_idx();
        commit( committed_index );

        if (quick_commit_index_ > prev_committed_index) {
            // Commit index has been changed as a result of log appending.
            // Send replication messages.
            request_append_entries_for_all();
        }
    } else {
        if (!ok) {
            // If log appending fails for follower, there is no way to proceed it.
            // We should stop the server immediately.
            recur_lock(lock_);
            p_ft("log appending failed, stop this server");
            ctx_->state_mgr_->system_exit(N21_log_flush_failed);
            return;
        }

        // Follower: wake up the waiting thread.
        ea_follower_log_append_->invoke();
    }
}